

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O1

void __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::addType
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this,string *name,CoreType type)

{
  iterator __position;
  int iVar1;
  vector<helics::CoreType,std::allocator<helics::CoreType>> *this_00;
  CoreType local_14;
  
  local_14 = type;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    this_00 = (vector<helics::CoreType,std::allocator<helics::CoreType>> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
              ::operator[](&this->typeMap,name);
    __position._M_current = *(CoreType **)(this_00 + 8);
    if (__position._M_current == *(CoreType **)(this_00 + 0x10)) {
      std::vector<helics::CoreType,std::allocator<helics::CoreType>>::
      _M_realloc_insert<helics::CoreType_const&>(this_00,__position,&local_14);
    }
    else {
      *__position._M_current = local_14;
      *(CoreType **)(this_00 + 8) = __position._M_current + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void addType(const std::string& name, Y type)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        typeMap[name].push_back(type);
    }